

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contract_light_test.cpp
# Opt level: O3

void __thiscall
ContractTestOnClassWithOutInvariant_ThatACallToAFailingPreconditionFireTheSetException_Test::
~ContractTestOnClassWithOutInvariant_ThatACallToAFailingPreconditionFireTheSetException_Test
          (ContractTestOnClassWithOutInvariant_ThatACallToAFailingPreconditionFireTheSetException_Test
           *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(ContractTestOnClassWithOutInvariant, ThatACallToAFailingPreconditionFireTheSetException)
{
  auto oldX = sut.x;
  auto oldY = sut.y;
  EXPECT_THROW(sut.setX(0), PreConditionFailedEx);

  EXPECT_TRUE(sut.preConditionWasCalled);
  EXPECT_FALSE(sut.postConditionWasCalled);

  EXPECT_EQ(oldX, sut.x);
  EXPECT_EQ(oldY, sut.y);
}